

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetExtensionLineOffset(ON_Annotation *this,ON_DimStyle *parent_style,double offset)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::ExtOffset(pOVar1);
  pOVar1 = Internal_GetOverrideStyle(this,offset * 2.220446049250313e-16 < ABS(offset - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetExtOffset(pOVar1,offset);
    ON_DimStyle::SetFieldOverride
              (pOVar1,ExtensionLineOffset,offset * 2.220446049250313e-16 < ABS(offset - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetExtensionLineOffset(const ON_DimStyle* parent_style, double offset)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(offset, parent_style->ExtOffset());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetExtOffset(offset);
    override_style->SetFieldOverride(ON_DimStyle::field::ExtensionLineOffset, bCreate);
  }
}